

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O0

void __thiscall
rsg::SubValueRangeIterator::SubValueRangeIterator
          (SubValueRangeIterator *this,ConstValueRangeAccess *valueRange)

{
  ConstValueRangeAccess *valueRange_local;
  SubValueRangeIterator *this_local;
  
  std::vector<rsg::ConstValueRangeAccess,_std::allocator<rsg::ConstValueRangeAccess>_>::vector
            (&this->m_stack);
  std::vector<rsg::ConstValueRangeAccess,_std::allocator<rsg::ConstValueRangeAccess>_>::push_back
            (&this->m_stack,valueRange);
  return;
}

Assistant:

SubValueRangeIterator::SubValueRangeIterator (const ConstValueRangeAccess& valueRange)
{
	m_stack.push_back(valueRange);
}